

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_fork_test.cpp
# Opt level: O0

void __thiscall
metacall_fork_test_DefaultConstructor_Test::~metacall_fork_test_DefaultConstructor_Test
          (metacall_fork_test_DefaultConstructor_Test *this)

{
  void *in_RDI;
  
  ~metacall_fork_test_DefaultConstructor_Test
            ((metacall_fork_test_DefaultConstructor_Test *)0x10b278);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(metacall_fork_test, DefaultConstructor)
{
	metacall_print_info();

	metacall_flags(METACALL_FLAGS_FORK_SAFE);

	ASSERT_EQ((int)0, (int)metacall_initialize());

	metacall_fork(&pre_callback_test, &post_callback_test);

	if (fork() == 0)
	{
		std::cout << "MetaCall fork child" << std::endl;
	}
	else
	{
		std::cout << "MetaCall fork parent" << std::endl;
	}

	EXPECT_EQ((int)1, (int)pre_callback_fired);
	EXPECT_EQ((int)1, (int)post_callback_fired);

	metacall_destroy();
}